

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2measures.cc
# Opt level: O2

double S2::Area(S2Point *a,S2Point *b,S2Point *c)

{
  bool bVar1;
  FloatType FVar2;
  FloatType FVar3;
  FloatType FVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  S2LogMessage local_28;
  
  bVar1 = IsUnitLength(a);
  if (bVar1) {
    bVar1 = IsUnitLength(b);
    if (bVar1) {
      bVar1 = IsUnitLength(c);
      if (bVar1) {
        FVar2 = Vector3<double>::Angle(b,c);
        FVar3 = Vector3<double>::Angle(c,a);
        FVar4 = Vector3<double>::Angle(a,b);
        dVar8 = (FVar2 + FVar3 + FVar4) * 0.5;
        if (0.0003 <= dVar8) {
          dVar6 = FVar4;
          if (FVar4 <= FVar3) {
            dVar6 = FVar3;
          }
          if (dVar6 <= FVar2) {
            dVar6 = FVar2;
          }
          if ((dVar8 - dVar6 < dVar8 * 0.01 * dVar8 * dVar8 * dVar8 * dVar8) &&
             (dVar5 = GirardArea(a,b,c), dVar8 - dVar6 < (dVar5 + 5e-15) * 0.1 * dVar8)) {
            return dVar5;
          }
        }
        dVar6 = tan(dVar8 * 0.5);
        dVar5 = tan((dVar8 - FVar2) * 0.5);
        dVar7 = tan((dVar8 - FVar3) * 0.5);
        dVar8 = tan((dVar8 - FVar4) * 0.5);
        dVar8 = dVar8 * dVar7 * dVar5 * dVar6;
        if (dVar8 <= 0.0) {
          dVar8 = 0.0;
        }
        dVar8 = atan(SQRT(dVar8));
        return dVar8 * 4.0;
      }
      S2LogMessage::S2LogMessage
                (&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2measures.cc"
                 ,0x3b,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_28.stream_,"Check failed: IsUnitLength(c) ");
    }
    else {
      S2LogMessage::S2LogMessage
                (&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2measures.cc"
                 ,0x3a,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_28.stream_,"Check failed: IsUnitLength(b) ");
    }
  }
  else {
    S2LogMessage::S2LogMessage
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2measures.cc"
               ,0x39,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_28.stream_,"Check failed: IsUnitLength(a) ");
  }
  abort();
}

Assistant:

double Area(const S2Point& a, const S2Point& b, const S2Point& c) {
  S2_DCHECK(IsUnitLength(a));
  S2_DCHECK(IsUnitLength(b));
  S2_DCHECK(IsUnitLength(c));
  // This method is based on l'Huilier's theorem,
  //
  //   tan(E/4) = sqrt(tan(s/2) tan((s-a)/2) tan((s-b)/2) tan((s-c)/2))
  //
  // where E is the spherical excess of the triangle (i.e. its area),
  //       a, b, c, are the side lengths, and
  //       s is the semiperimeter (a + b + c) / 2 .
  //
  // The only significant source of error using l'Huilier's method is the
  // cancellation error of the terms (s-a), (s-b), (s-c).  This leads to a
  // *relative* error of about 1e-16 * s / min(s-a, s-b, s-c).  This compares
  // to a relative error of about 1e-15 / E using Girard's formula, where E is
  // the true area of the triangle.  Girard's formula can be even worse than
  // this for very small triangles, e.g. a triangle with a true area of 1e-30
  // might evaluate to 1e-5.
  //
  // So, we prefer l'Huilier's formula unless dmin < s * (0.1 * E), where
  // dmin = min(s-a, s-b, s-c).  This basically includes all triangles
  // except for extremely long and skinny ones.
  //
  // Since we don't know E, we would like a conservative upper bound on
  // the triangle area in terms of s and dmin.  It's possible to show that
  // E <= k1 * s * sqrt(s * dmin), where k1 = 2*sqrt(3)/Pi (about 1).
  // Using this, it's easy to show that we should always use l'Huilier's
  // method if dmin >= k2 * s^5, where k2 is about 1e-2.  Furthermore,
  // if dmin < k2 * s^5, the triangle area is at most k3 * s^4, where
  // k3 is about 0.1.  Since the best case error using Girard's formula
  // is about 1e-15, this means that we shouldn't even consider it unless
  // s >= 3e-4 or so.
  //
  // TODO(ericv): Implement rigorous error bounds (analysis already done).
  double sa = b.Angle(c);
  double sb = c.Angle(a);
  double sc = a.Angle(b);
  double s = 0.5 * (sa + sb + sc);
  if (s >= 3e-4) {
    // Consider whether Girard's formula might be more accurate.
    double s2 = s * s;
    double dmin = s - max(sa, max(sb, sc));
    if (dmin < 1e-2 * s * s2 * s2) {
      // This triangle is skinny enough to consider using Girard's formula.
      // We increase the area by the approximate maximum error in the Girard
      // calculation in order to ensure that this test is conservative.
      double area = GirardArea(a, b, c);
      if (dmin < s * (0.1 * (area + 5e-15))) return area;
    }
  }
  // Use l'Huilier's formula.
  return 4 * atan(sqrt(max(0.0, tan(0.5 * s) * tan(0.5 * (s - sa)) *
                           tan(0.5 * (s - sb)) * tan(0.5 * (s - sc)))));
}